

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O1

int fffr4u4(float *input,long ntodo,double scale,double zero,int nullcheck,unsigned_long nullval,
           char *nullarray,int *anynull,unsigned_long *output,int *status)

{
  float fVar1;
  ushort uVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  
  if (nullcheck == 0) {
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      if (0 < ntodo) {
        lVar5 = 0;
        do {
          dVar6 = (double)input[lVar5] * scale + zero;
          if (-0.49 <= dVar6) {
            if (dVar6 <= 1.844674407370955e+19) {
              uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
            }
            else {
              *status = -0xb;
              uVar4 = 0xffffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            uVar4 = 0;
          }
          output[lVar5] = uVar4;
          lVar5 = lVar5 + 1;
        } while (ntodo != lVar5);
      }
    }
    else if (0 < ntodo) {
      lVar5 = 0;
      do {
        fVar1 = input[lVar5];
        if (-0.49 <= fVar1) {
          if (fVar1 <= 1.8446744e+19) {
            uVar4 = (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1;
          }
          else {
            *status = -0xb;
            uVar4 = 0xffffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          uVar4 = 0;
        }
        output[lVar5] = uVar4;
        lVar5 = lVar5 + 1;
      } while (ntodo != lVar5);
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    if (0 < ntodo) {
      lVar5 = 0;
      do {
        uVar2 = *(ushort *)((long)input + lVar5 * 4 + 2);
        cVar3 = ((uVar2 & 0x7f80) == 0) * '\x02';
        if ((uVar2 & 0x7f80) == 0x7f80) {
          cVar3 = '\x01';
        }
        if (cVar3 == '\0') {
          dVar6 = (double)input[lVar5] * scale + zero;
          if (dVar6 < -0.49) {
LAB_00166195:
            *status = -0xb;
            output[lVar5] = 0;
          }
          else if (1.844674407370955e+19 < dVar6) {
LAB_001661b2:
            *status = -0xb;
            output[lVar5] = 0xffffffffffffffff;
          }
          else {
            output[lVar5] =
                 (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
          }
        }
        else if (cVar3 == '\x01') {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar5] = nullval;
          }
          else {
            nullarray[lVar5] = '\x01';
          }
        }
        else {
          if (zero < -0.49) goto LAB_00166195;
          if (1.844674407370955e+19 < zero) goto LAB_001661b2;
          output[lVar5] = (long)(zero - 9.223372036854776e+18) & (long)zero >> 0x3f | (long)zero;
        }
        lVar5 = lVar5 + 1;
      } while (ntodo != lVar5);
    }
  }
  else if (0 < ntodo) {
    lVar5 = 0;
    do {
      uVar2 = *(ushort *)((long)input + lVar5 * 4 + 2);
      cVar3 = ((uVar2 & 0x7f80) == 0) * '\x02';
      if ((uVar2 & 0x7f80) == 0x7f80) {
        cVar3 = '\x01';
      }
      if (cVar3 == '\0') {
        fVar1 = input[lVar5];
        if (fVar1 < -0.49) {
          *status = -0xb;
          goto LAB_00165fcb;
        }
        if (fVar1 <= 1.8446744e+19) {
          output[lVar5] = (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1;
        }
        else {
          *status = -0xb;
          output[lVar5] = 0xffffffffffffffff;
        }
      }
      else if (cVar3 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar5] = nullval;
        }
        else {
          nullarray[lVar5] = '\x01';
        }
      }
      else {
LAB_00165fcb:
        output[lVar5] = 0;
      }
      lVar5 = lVar5 + 1;
    } while (ntodo != lVar5);
  }
  return *status;
}

Assistant:

int fffr4u4(float *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
   unsigned long nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned long *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (input[ii] > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr++;       /* point to MSBs */
#endif

        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (input[ii] > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 2)
            {
              if (0 != (iret = fnan(*sptr) ) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  { 
                    if (zero < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (zero > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                      output[ii] = (unsigned long) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) dvalue;
                }
            }
        }
    }
    return(*status);
}